

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

VkBufferMemoryBarrier *
vkt::BindingModel::anon_unknown_1::TexelBufferInstanceBuffers::createBarrier
          (VkBufferMemoryBarrier *__return_storage_ptr__,VkDescriptorType descriptorType,
          VkBuffer buffer)

{
  bool bVar1;
  VkAccessFlags VVar2;
  VkAccessFlags inputBit;
  VkDescriptorType descriptorType_local;
  VkBuffer buffer_local;
  
  bVar1 = isUniformDescriptorType(descriptorType);
  VVar2 = 0x20;
  if (bVar1) {
    VVar2 = 8;
  }
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->srcAccessMask = 0x4000;
  __return_storage_ptr__->dstAccessMask = VVar2;
  __return_storage_ptr__->srcQueueFamilyIndex = 0xffffffff;
  __return_storage_ptr__->dstQueueFamilyIndex = 0xffffffff;
  (__return_storage_ptr__->buffer).m_internal = buffer.m_internal;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->size = 0x200;
  return __return_storage_ptr__;
}

Assistant:

vk::VkBufferMemoryBarrier TexelBufferInstanceBuffers::createBarrier (vk::VkDescriptorType descriptorType, vk::VkBuffer buffer)
{
	const vk::VkAccessFlags			inputBit	= (isUniformDescriptorType(descriptorType)) ? (vk::VK_ACCESS_UNIFORM_READ_BIT) : (vk::VK_ACCESS_SHADER_READ_BIT);
	const vk::VkBufferMemoryBarrier	barrier		=
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
		DE_NULL,
		vk::VK_ACCESS_HOST_WRITE_BIT,			// outputMask
		inputBit,								// inputMask
		VK_QUEUE_FAMILY_IGNORED,				// srcQueueFamilyIndex
		VK_QUEUE_FAMILY_IGNORED,				// destQueueFamilyIndex
		buffer	,								// buffer
		0u,										// offset
		(vk::VkDeviceSize)BUFFER_SIZE			// size
	};
	return barrier;
}